

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O0

int mbedtls_camellia_setkey_enc(mbedtls_camellia_context *ctx,uchar *key,uint keybits)

{
  char cVar1;
  uint local_138 [2];
  uint32_t TK [20];
  uint32_t KC [16];
  uint32_t SIGMA [6] [2];
  uchar t [64];
  uint32_t *RK;
  size_t i;
  int idx;
  uint keybits_local;
  uchar *key_local;
  mbedtls_camellia_context *ctx_local;
  
  t._56_8_ = ctx->rk;
  t[0x28] = '\0';
  t[0x29] = '\0';
  t[0x2a] = '\0';
  t[0x2b] = '\0';
  t[0x2c] = '\0';
  t[0x2d] = '\0';
  t[0x2e] = '\0';
  t[0x2f] = '\0';
  t[0x30] = '\0';
  t[0x31] = '\0';
  t[0x32] = '\0';
  t[0x33] = '\0';
  t[0x34] = '\0';
  t[0x35] = '\0';
  t[0x36] = '\0';
  t[0x37] = '\0';
  t[0x18] = '\0';
  t[0x19] = '\0';
  t[0x1a] = '\0';
  t[0x1b] = '\0';
  t[0x1c] = '\0';
  t[0x1d] = '\0';
  t[0x1e] = '\0';
  t[0x1f] = '\0';
  t[0x20] = '\0';
  t[0x21] = '\0';
  t[0x22] = '\0';
  t[0x23] = '\0';
  t[0x24] = '\0';
  t[0x25] = '\0';
  t[0x26] = '\0';
  t[0x27] = '\0';
  t[8] = '\0';
  t[9] = '\0';
  t[10] = '\0';
  t[0xb] = '\0';
  t[0xc] = '\0';
  t[0xd] = '\0';
  t[0xe] = '\0';
  t[0xf] = '\0';
  t[0x10] = '\0';
  t[0x11] = '\0';
  t[0x12] = '\0';
  t[0x13] = '\0';
  t[0x14] = '\0';
  t[0x15] = '\0';
  t[0x16] = '\0';
  t[0x17] = '\0';
  SIGMA[5][0] = 0;
  SIGMA[5][1] = 0;
  t[0] = '\0';
  t[1] = '\0';
  t[2] = '\0';
  t[3] = '\0';
  t[4] = '\0';
  t[5] = '\0';
  t[6] = '\0';
  t[7] = '\0';
  memset((void *)t._56_8_,0,0x110);
  if (keybits == 0x80) {
    ctx->nr = 3;
    i._0_4_ = 0;
  }
  else {
    if ((keybits != 0xc0) && (keybits != 0x100)) {
      return -0x24;
    }
    ctx->nr = 4;
    i._0_4_ = 1;
  }
  for (RK = (uint32_t *)0x0; RK < (uint32_t *)(ulong)(keybits >> 3); RK = (uint32_t *)((long)RK + 1)
      ) {
    *(uchar *)((long)SIGMA[5] + (long)RK) = key[(long)RK];
  }
  if (keybits == 0xc0) {
    for (RK = (uint32_t *)0x0; RK < (uint32_t *)0x8; RK = (uint32_t *)((long)RK + 1)) {
      (&stack0x00000000)[(long)(RK + -0x18)] = (&stack0x00000000)[(long)(RK + -0x1a)] ^ 0xff;
    }
  }
  for (RK = (uint32_t *)0x0; RK < (uint32_t *)0x6; RK = (uint32_t *)((long)RK + 1)) {
    SIGMA[(long)RK + -1][0] =
         (uint)SIGMA_CHARS[(long)RK][0] << 0x18 | (uint)SIGMA_CHARS[(long)RK][1] << 0x10 |
         (uint)SIGMA_CHARS[(long)RK][2] << 8 | (uint)SIGMA_CHARS[(long)RK][3];
    SIGMA[(long)RK + -1][1] =
         (uint)SIGMA_CHARS[(long)RK][4] << 0x18 | (uint)SIGMA_CHARS[(long)RK][5] << 0x10 |
         (uint)SIGMA_CHARS[(long)RK][6] << 8 | (uint)SIGMA_CHARS[(long)RK][7];
  }
  memset(TK + 0x12,0,0x40);
  for (RK = (uint32_t *)0x0; RK < (uint32_t *)0x8; RK = (uint32_t *)((long)RK + 1)) {
    TK[(long)RK + 0x12] =
         (uint)t[(long)RK * 4 + -8] << 0x18 | (uint)t[(long)RK * 4 + -7] << 0x10 |
         (uint)t[(long)RK * 4 + -6] << 8 | (uint)t[(long)RK * 4 + -5];
  }
  for (RK = (uint32_t *)0x0; RK < (uint32_t *)0x4; RK = (uint32_t *)((long)RK + 1)) {
    TK[(long)(RK + 2) + 0x12] = TK[(long)RK + 0x12] ^ TK[(long)(RK + 1) + 0x12];
  }
  camellia_feistel(KC + 6,KC + 0xe,KC + 8);
  camellia_feistel(KC + 8,SIGMA[0],KC + 6);
  for (RK = (uint32_t *)0x0; RK < (uint32_t *)0x4; RK = (uint32_t *)((long)RK + 1)) {
    TK[(long)(RK + 2) + 0x12] = TK[(long)RK + 0x12] ^ TK[(long)(RK + 2) + 0x12];
  }
  camellia_feistel(KC + 6,SIGMA[1],KC + 8);
  camellia_feistel(KC + 8,SIGMA[2],KC + 6);
  if (0x80 < keybits) {
    for (RK = (uint32_t *)0x0; RK < (uint32_t *)0x4; RK = (uint32_t *)((long)RK + 1)) {
      TK[(long)(RK + 3) + 0x12] = TK[(long)(RK + 1) + 0x12] ^ TK[(long)(RK + 2) + 0x12];
    }
    camellia_feistel(KC + 10,SIGMA[3],KC + 0xc);
    camellia_feistel(KC + 0xc,SIGMA[4],KC + 10);
  }
  local_138[0] = TK[0x12];
  local_138[1] = TK[0x13];
  TK[0] = KC[0];
  TK[1] = KC[1];
  for (RK = (uint32_t *)0x1; RK < (uint32_t *)0x5; RK = (uint32_t *)((long)RK + 1)) {
    if (*(char *)((long)RK + (long)(int)i * 0x10 + 0x15ec1f) != '\0') {
      cVar1 = (char)RK;
      local_138[(long)RK * 4] =
           local_138[0] << (cVar1 * '\x0f' & 0x1fU) ^
           local_138[1] >> (0x20 - (cVar1 * '\x0f' & 0x1fU) & 0x1f);
      TK[(long)RK * 4 + -1] =
           local_138[1] << (cVar1 * '\x0f' & 0x1fU) ^
           TK[0] >> (0x20 - (cVar1 * '\x0f' & 0x1fU) & 0x1f);
      TK[(long)RK * 4] =
           TK[0] << (cVar1 * '\x0f' & 0x1fU) ^ TK[1] >> (0x20 - (cVar1 * '\x0f' & 0x1fU) & 0x1f);
      TK[(long)RK * 4 + 1] =
           TK[1] << (cVar1 * '\x0f' & 0x1fU) ^
           local_138[0] >> (0x20 - (cVar1 * '\x0f' & 0x1fU) & 0x1f);
    }
  }
  for (RK = (uint32_t *)0x0; RK < (uint32_t *)0x14; RK = (uint32_t *)((long)RK + 1)) {
    if (indexes[(int)i][0][(long)RK] != -1) {
      *(uint *)(t._56_8_ + (long)indexes[(int)i][0][(long)RK] * 4) = local_138[(long)RK];
    }
  }
  if (0x80 < keybits) {
    local_138[0] = KC[2];
    local_138[1] = KC[3];
    TK[0] = KC[4];
    TK[1] = KC[5];
    for (RK = (uint32_t *)0x1; RK < (uint32_t *)0x5; RK = (uint32_t *)((long)RK + 1)) {
      if (*(char *)((long)RK + (long)(int)i * 0x10 + 0x15ec23) != '\0') {
        cVar1 = (char)RK;
        local_138[(long)RK * 4] =
             local_138[0] << (cVar1 * '\x0f' & 0x1fU) ^
             local_138[1] >> (0x20 - (cVar1 * '\x0f' & 0x1fU) & 0x1f);
        TK[(long)RK * 4 + -1] =
             local_138[1] << (cVar1 * '\x0f' & 0x1fU) ^
             TK[0] >> (0x20 - (cVar1 * '\x0f' & 0x1fU) & 0x1f);
        TK[(long)RK * 4] =
             TK[0] << (cVar1 * '\x0f' & 0x1fU) ^ TK[1] >> (0x20 - (cVar1 * '\x0f' & 0x1fU) & 0x1f);
        TK[(long)RK * 4 + 1] =
             TK[1] << (cVar1 * '\x0f' & 0x1fU) ^
             local_138[0] >> (0x20 - (cVar1 * '\x0f' & 0x1fU) & 0x1f);
      }
    }
    for (RK = (uint32_t *)0x0; RK < (uint32_t *)0x14; RK = (uint32_t *)((long)RK + 1)) {
      if ((char)RK[(long)(int)i * 0x14 + 0x57b15] != -1) {
        *(uint *)(t._56_8_ + (long)(char)RK[(long)(int)i * 0x14 + 0x57b15] * 4) =
             local_138[(long)RK];
      }
    }
  }
  local_138[0] = KC[6];
  local_138[1] = KC[7];
  TK[0] = KC[8];
  TK[1] = KC[9];
  for (RK = (uint32_t *)0x1; RK < (uint32_t *)0x5; RK = (uint32_t *)((long)RK + 1)) {
    if (*(char *)((long)RK + (long)(int)i * 0x10 + 0x15ec27) != '\0') {
      cVar1 = (char)RK;
      local_138[(long)RK * 4] =
           local_138[0] << (cVar1 * '\x0f' & 0x1fU) ^
           local_138[1] >> (0x20 - (cVar1 * '\x0f' & 0x1fU) & 0x1f);
      TK[(long)RK * 4 + -1] =
           local_138[1] << (cVar1 * '\x0f' & 0x1fU) ^
           TK[0] >> (0x20 - (cVar1 * '\x0f' & 0x1fU) & 0x1f);
      TK[(long)RK * 4] =
           TK[0] << (cVar1 * '\x0f' & 0x1fU) ^ TK[1] >> (0x20 - (cVar1 * '\x0f' & 0x1fU) & 0x1f);
      TK[(long)RK * 4 + 1] =
           TK[1] << (cVar1 * '\x0f' & 0x1fU) ^
           local_138[0] >> (0x20 - (cVar1 * '\x0f' & 0x1fU) & 0x1f);
    }
  }
  for (RK = (uint32_t *)0x0; RK < (uint32_t *)0x14; RK = (uint32_t *)((long)RK + 1)) {
    if ((char)RK[(long)(int)i * 0x14 + 0x57b1a] != -1) {
      *(uint *)(t._56_8_ + (long)(char)RK[(long)(int)i * 0x14 + 0x57b1a] * 4) = local_138[(long)RK];
    }
  }
  if (0x80 < keybits) {
    local_138[0] = KC[10];
    local_138[1] = KC[0xb];
    TK[0] = KC[0xc];
    TK[1] = KC[0xd];
    for (RK = (uint32_t *)0x1; RK < (uint32_t *)0x5; RK = (uint32_t *)((long)RK + 1)) {
      if (*(char *)((long)RK + (long)(int)i * 0x10 + 0x15ec2b) != '\0') {
        cVar1 = (char)RK;
        local_138[(long)RK * 4] =
             local_138[0] << (cVar1 * '\x0f' & 0x1fU) ^
             local_138[1] >> (0x20 - (cVar1 * '\x0f' & 0x1fU) & 0x1f);
        TK[(long)RK * 4 + -1] =
             local_138[1] << (cVar1 * '\x0f' & 0x1fU) ^
             TK[0] >> (0x20 - (cVar1 * '\x0f' & 0x1fU) & 0x1f);
        TK[(long)RK * 4] =
             TK[0] << (cVar1 * '\x0f' & 0x1fU) ^ TK[1] >> (0x20 - (cVar1 * '\x0f' & 0x1fU) & 0x1f);
        TK[(long)RK * 4 + 1] =
             TK[1] << (cVar1 * '\x0f' & 0x1fU) ^
             local_138[0] >> (0x20 - (cVar1 * '\x0f' & 0x1fU) & 0x1f);
      }
    }
    for (RK = (uint32_t *)0x0; RK < (uint32_t *)0x14; RK = (uint32_t *)((long)RK + 1)) {
      if ((char)RK[(long)(int)i * 0x14 + 0x57b1f] != -1) {
        *(uint *)(t._56_8_ + (long)(char)RK[(long)(int)i * 0x14 + 0x57b1f] * 4) =
             local_138[(long)RK];
      }
    }
  }
  for (RK = (uint32_t *)0x0; RK < (uint32_t *)0x14; RK = (uint32_t *)((long)RK + 1)) {
    if (transposes[(int)i][(long)RK] != -1) {
      *(undefined4 *)(t._56_8_ + ((long)((int)i * 0xc + 0x20) + (long)RK) * 4) =
           *(undefined4 *)(t._56_8_ + (long)transposes[(int)i][(long)RK] * 4);
    }
  }
  return 0;
}

Assistant:

int mbedtls_camellia_setkey_enc( mbedtls_camellia_context *ctx, const unsigned char *key,
                         unsigned int keybits )
{
    int idx;
    size_t i;
    uint32_t *RK;
    unsigned char t[64];
    uint32_t SIGMA[6][2];
    uint32_t KC[16];
    uint32_t TK[20];

    RK = ctx->rk;

    memset( t, 0, 64 );
    memset( RK, 0, sizeof(ctx->rk) );

    switch( keybits )
    {
        case 128: ctx->nr = 3; idx = 0; break;
        case 192:
        case 256: ctx->nr = 4; idx = 1; break;
        default : return( MBEDTLS_ERR_CAMELLIA_INVALID_KEY_LENGTH );
    }

    for( i = 0; i < keybits / 8; ++i )
        t[i] = key[i];

    if( keybits == 192 ) {
        for( i = 0; i < 8; i++ )
            t[24 + i] = ~t[16 + i];
    }

    /*
     * Prepare SIGMA values
     */
    for( i = 0; i < 6; i++ ) {
        GET_UINT32_BE( SIGMA[i][0], SIGMA_CHARS[i], 0 );
        GET_UINT32_BE( SIGMA[i][1], SIGMA_CHARS[i], 4 );
    }

    /*
     * Key storage in KC
     * Order: KL, KR, KA, KB
     */
    memset( KC, 0, sizeof(KC) );

    /* Store KL, KR */
    for( i = 0; i < 8; i++ )
        GET_UINT32_BE( KC[i], t, i * 4 );

    /* Generate KA */
    for( i = 0; i < 4; ++i )
        KC[8 + i] = KC[i] ^ KC[4 + i];

    camellia_feistel( KC + 8, SIGMA[0], KC + 10 );
    camellia_feistel( KC + 10, SIGMA[1], KC + 8 );

    for( i = 0; i < 4; ++i )
        KC[8 + i] ^= KC[i];

    camellia_feistel( KC + 8, SIGMA[2], KC + 10 );
    camellia_feistel( KC + 10, SIGMA[3], KC + 8 );

    if( keybits > 128 ) {
        /* Generate KB */
        for( i = 0; i < 4; ++i )
            KC[12 + i] = KC[4 + i] ^ KC[8 + i];

        camellia_feistel( KC + 12, SIGMA[4], KC + 14 );
        camellia_feistel( KC + 14, SIGMA[5], KC + 12 );
    }

    /*
     * Generating subkeys
     */

    /* Manipulating KL */
    SHIFT_AND_PLACE( idx, 0 );

    /* Manipulating KR */
    if( keybits > 128 ) {
        SHIFT_AND_PLACE( idx, 1 );
    }

    /* Manipulating KA */
    SHIFT_AND_PLACE( idx, 2 );

    /* Manipulating KB */
    if( keybits > 128 ) {
        SHIFT_AND_PLACE( idx, 3 );
    }

    /* Do transpositions */
    for( i = 0; i < 20; i++ ) {
        if( transposes[idx][i] != -1 ) {
            RK[32 + 12 * idx + i] = RK[transposes[idx][i]];
        }
    }

    return( 0 );
}